

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::execMoveUspAn<(moira::Instr)76,(moira::Mode)12,(moira::Size)4>(Moira *this,u16 opcode)

{
  if ((this->reg).sr.s != false) {
    prefetch<4ul>(this);
    *(undefined4 *)((long)this->exec + (ulong)(opcode & 7) * 4 + -0x38) =
         *(undefined4 *)((long)this->exec + (ulong)(this->reg).sr.s * 4 + -0x1c);
    return;
  }
  execPrivilegeException(this);
  return;
}

Assistant:

void
Moira::execMoveUspAn(u16 opcode)
{
    SUPERVISOR_MODE_ONLY

    int an = _____________xxx(opcode);
    prefetch<POLLIPL>();
    writeA(an, getUSP());
}